

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

void __thiscall
google::
dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
::dense_hashtable(dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
                  *this,size_type expected_max_items_in_table,Hasher *hf,Hasher *eql,SelectKey *ext,
                 SetKey *set,
                 libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_> *alloc)

{
  int iVar1;
  size_type num_buckets;
  
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_compares_ = hf->num_compares_;
  iVar1 = hf->num_hashes_;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.id_ =
       hf->id_;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
  num_hashes_ = iVar1;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
       false;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_empty_ = false;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_ = false;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.num_ht_copies_ = 0;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_threshold_ = 0
  ;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_ = 0;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_factor_ = 0.5;
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_ = 0.2;
  iVar1 = eql->num_hashes_;
  (this->key_info).super_Hasher.id_ = eql->id_;
  (this->key_info).super_Hasher.num_hashes_ = iVar1;
  (this->key_info).super_Hasher.num_compares_ = eql->num_compares_;
  (this->key_info).delkey = 0;
  (this->key_info).empty_key = 0;
  this->num_deleted = 0;
  this->num_elements = 0;
  if (expected_max_items_in_table == 0) {
    num_buckets = 0x20;
  }
  else {
    num_buckets = sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::
                  min_buckets((sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *)this,
                              expected_max_items_in_table,0);
  }
  this->num_buckets = num_buckets;
  this->table = (pointer)0x0;
  sparsehash_internal::sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<int,_Hasher,_unsigned_long,_4> *)this,num_buckets);
  return;
}

Assistant:

explicit dense_hashtable(size_type expected_max_items_in_table = 0,
                           const HashFcn& hf = HashFcn(),
                           const EqualKey& eql = EqualKey(),
                           const ExtractKey& ext = ExtractKey(),
                           const SetKey& set = SetKey(),
                           const Alloc& alloc = Alloc())
      : settings(hf),
        key_info(ext, set, eql),
        num_deleted(0),
        num_elements(0),
        num_buckets(expected_max_items_in_table == 0
                        ? HT_DEFAULT_STARTING_BUCKETS
                        : settings.min_buckets(expected_max_items_in_table, 0)),
        val_info(alloc_impl<value_alloc_type>(alloc)),
        table(NULL) {
    // table is NULL until emptyval is set.  However, we set num_buckets
    // here so we know how much space to allocate once emptyval is set
    settings.reset_thresholds(bucket_count());
  }